

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

int Hop_ObjIsMuxType(Hop_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pObj_00;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  bool local_55;
  bool local_31;
  Hop_Obj_t *pNode1;
  Hop_Obj_t *pNode0;
  Hop_Obj_t *pNode_local;
  
  iVar1 = Hop_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0x9b,"int Hop_ObjIsMuxType(Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsAnd(pNode);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = Hop_ObjFaninC0(pNode);
  if ((iVar1 == 0) || (iVar1 = Hop_ObjFaninC1(pNode), iVar1 == 0)) {
    return 0;
  }
  pObj = Hop_ObjFanin0(pNode);
  pObj_00 = Hop_ObjFanin1(pNode);
  iVar1 = Hop_ObjIsAnd(pObj);
  if ((iVar1 == 0) || (iVar1 = Hop_ObjIsAnd(pObj_00), iVar1 == 0)) {
    return 0;
  }
  pHVar3 = Hop_ObjFanin0(pObj);
  pHVar4 = Hop_ObjFanin0(pObj_00);
  if (pHVar3 == pHVar4) {
    iVar1 = Hop_ObjFaninC0(pObj);
    iVar2 = Hop_ObjFaninC0(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_00a42c7b;
  }
  pHVar3 = Hop_ObjFanin0(pObj);
  pHVar4 = Hop_ObjFanin1(pObj_00);
  if (pHVar3 == pHVar4) {
    iVar1 = Hop_ObjFaninC0(pObj);
    iVar2 = Hop_ObjFaninC1(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_00a42c7b;
  }
  pHVar3 = Hop_ObjFanin1(pObj);
  pHVar4 = Hop_ObjFanin0(pObj_00);
  if (pHVar3 == pHVar4) {
    iVar1 = Hop_ObjFaninC1(pObj);
    iVar2 = Hop_ObjFaninC0(pObj_00);
    local_31 = true;
    if (iVar1 != iVar2) goto LAB_00a42c7b;
  }
  pHVar3 = Hop_ObjFanin1(pObj);
  pHVar4 = Hop_ObjFanin1(pObj_00);
  local_55 = false;
  if (pHVar3 == pHVar4) {
    iVar1 = Hop_ObjFaninC1(pObj);
    iVar2 = Hop_ObjFaninC1(pObj_00);
    local_55 = iVar1 != iVar2;
  }
  local_31 = local_55;
LAB_00a42c7b:
  return (uint)local_31;
}

Assistant:

int Hop_ObjIsMuxType( Hop_Obj_t * pNode )
{
    Hop_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Hop_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Hop_ObjIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Hop_ObjFaninC0(pNode) || !Hop_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Hop_ObjFanin0(pNode);
    pNode1 = Hop_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Hop_ObjIsAnd(pNode0) || !Hop_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Hop_ObjFanin0(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC0(pNode1))) || 
           (Hop_ObjFanin0(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC1(pNode1))) ||
           (Hop_ObjFanin1(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC0(pNode1))) ||
           (Hop_ObjFanin1(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC1(pNode1)));
}